

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O3

void av1_rd_cost_update(int mult,RD_STATS *rd_cost)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = rd_cost->rate;
  if ((((ulong)uVar1 != 0x7fffffff) && (lVar2 = rd_cost->dist, lVar2 != 0x7fffffffffffffff)) &&
     (rd_cost->rdcost != 0x7fffffffffffffff)) {
    if ((int)uVar1 < 0) {
      lVar2 = lVar2 * 0x80 - ((long)((long)mult * (ulong)-uVar1 + 0x100) >> 9);
    }
    else {
      lVar2 = lVar2 * 0x80 + ((long)((ulong)uVar1 * (long)mult + 0x100) >> 9);
    }
    rd_cost->rdcost = lVar2;
    return;
  }
  rd_cost->rate = 0x7fffffff;
  rd_cost->zero_rate = 0;
  rd_cost->dist = 0x7fffffffffffffff;
  rd_cost->rdcost = 0x7fffffffffffffff;
  rd_cost->sse = 0x7fffffffffffffff;
  rd_cost->skip_txfm = '\0';
  return;
}

Assistant:

static inline void av1_rd_cost_update(int mult, RD_STATS *rd_cost) {
  if (rd_cost->rate < INT_MAX && rd_cost->dist < INT64_MAX &&
      rd_cost->rdcost < INT64_MAX) {
    rd_cost->rdcost = av1_calculate_rd_cost(mult, rd_cost->rate, rd_cost->dist);
  } else {
    av1_invalid_rd_stats(rd_cost);
  }
}